

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O2

void __thiscall QSqlQueryModel::clear(QSqlQueryModel *this)

{
  long lVar1;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QSqlError local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  beginResetModel(this);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  QSqlError::QSqlError
            (&local_40,(QString *)&local_58,(QString *)&local_78,NoError,(QString *)&local_98);
  QVar2.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)
                ((totally_ordered_wrapper<QSqlErrorPrivate_*> *)(lVar1 + 0xe0))->ptr;
  ((QExplicitlySharedDataPointer<QSqlErrorPrivate> *)(lVar1 + 0xe0))->d =
       (totally_ordered_wrapper<QSqlErrorPrivate_*>)local_40.d.d.ptr;
  local_40.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar2.d.ptr;
  QSqlError::~QSqlError(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  *(byte *)(lVar1 + 0x108) = *(byte *)(lVar1 + 0x108) | 1;
  QSqlQuery::clear((QSqlQuery *)(lVar1 + 0xd8));
  QSqlRecord::clear((QSqlRecord *)(lVar1 + 0x100));
  *(undefined8 *)(lVar1 + 0x130) = 0;
  *(undefined8 *)(lVar1 + 0xe8) = 0xffffffffffffffff;
  *(undefined8 *)(lVar1 + 0xf0) = 0;
  *(undefined8 *)(lVar1 + 0xf8) = 0;
  QList<QHash<int,_QVariant>_>::clear((QList<QHash<int,_QVariant>_> *)(lVar1 + 0x110));
  endResetModel(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlQueryModel::clear()
{
    Q_D(QSqlQueryModel);
    beginResetModel();
    d->error = QSqlError();
    d->atEnd = true;
    d->query.clear();
    d->rec.clear();
    d->colOffsets.clear();
    d->bottom = QModelIndex();
    d->headers.clear();
    endResetModel();
}